

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coreaction.cc
# Opt level: O3

bool ActionMarkImplied::checkImpliedCover(Funcdata *data,Varnode *vn)

{
  PcodeOp *pPVar1;
  PcodeOp *pPVar2;
  Varnode *a;
  bool bVar3;
  const_iterator cVar4;
  const_iterator cVar5;
  pointer ppFVar6;
  HighVariable *high;
  pointer ppVVar7;
  pointer ppVVar8;
  long lVar9;
  
  pPVar1 = vn->def;
  if (pPVar1->opcode->opcode == CPUI_LOAD) {
    cVar4 = PcodeOpBank::end(&data->obank,CPUI_STORE);
    for (cVar5 = PcodeOpBank::begin(&data->obank,CPUI_STORE); cVar5._M_node != cVar4._M_node;
        cVar5._M_node = (cVar5._M_node)->_M_next) {
      pPVar2 = (PcodeOp *)cVar5._M_node[1]._M_next;
      if ((pPVar2->flags & 0x20) == 0) {
        Varnode::updateCover(vn);
        bVar3 = Cover::contain(vn->cover,pPVar2,2);
        if (bVar3) {
          ppVVar7 = (pPVar2->inrefs).super__Vector_base<Varnode_*,_std::allocator<Varnode_*>_>.
                    _M_impl.super__Vector_impl_data._M_start;
          ppVVar8 = (pPVar1->inrefs).super__Vector_base<Varnode_*,_std::allocator<Varnode_*>_>.
                    _M_impl.super__Vector_impl_data._M_start;
          if ((((*ppVVar7)->loc).offset == ((*ppVVar8)->loc).offset) &&
             (bVar3 = isPossibleAlias(ppVVar7[1],ppVVar8[1],2), bVar3)) {
            return false;
          }
        }
      }
    }
  }
  if ((((pPVar1->flags & 4) != 0) || (pPVar1->opcode->opcode == CPUI_LOAD)) &&
     (ppFVar6 = (data->qlst).super__Vector_base<FuncCallSpecs_*,_std::allocator<FuncCallSpecs_*>_>.
                _M_impl.super__Vector_impl_data._M_start,
     0 < (int)((ulong)((long)(data->qlst).
                             super__Vector_base<FuncCallSpecs_*,_std::allocator<FuncCallSpecs_*>_>.
                             _M_impl.super__Vector_impl_data._M_finish - (long)ppFVar6) >> 3))) {
    lVar9 = 0;
    do {
      pPVar2 = ppFVar6[lVar9]->op;
      Varnode::updateCover(vn);
      bVar3 = Cover::contain(vn->cover,pPVar2,2);
      if (bVar3) {
        return false;
      }
      lVar9 = lVar9 + 1;
      ppFVar6 = (data->qlst).super__Vector_base<FuncCallSpecs_*,_std::allocator<FuncCallSpecs_*>_>.
                _M_impl.super__Vector_impl_data._M_start;
    } while (lVar9 < (int)((ulong)((long)(data->qlst).
                                         super__Vector_base<FuncCallSpecs_*,_std::allocator<FuncCallSpecs_*>_>
                                         ._M_impl.super__Vector_impl_data._M_finish - (long)ppFVar6)
                          >> 3));
  }
  ppVVar7 = (pPVar1->inrefs).super__Vector_base<Varnode_*,_std::allocator<Varnode_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  ppVVar8 = (pPVar1->inrefs).super__Vector_base<Varnode_*,_std::allocator<Varnode_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  if (0 < (int)((ulong)((long)ppVVar8 - (long)ppVVar7) >> 3)) {
    lVar9 = 0;
    do {
      a = ppVVar7[lVar9];
      if ((a->flags & 2) == 0) {
        high = Varnode::getHigh(vn);
        bVar3 = Merge::inflateTest(&data->covermerge,a,high);
        if (bVar3) {
          return false;
        }
        ppVVar7 = (pPVar1->inrefs).super__Vector_base<Varnode_*,_std::allocator<Varnode_*>_>._M_impl
                  .super__Vector_impl_data._M_start;
        ppVVar8 = (pPVar1->inrefs).super__Vector_base<Varnode_*,_std::allocator<Varnode_*>_>._M_impl
                  .super__Vector_impl_data._M_finish;
      }
      lVar9 = lVar9 + 1;
    } while (lVar9 < (int)((ulong)((long)ppVVar8 - (long)ppVVar7) >> 3));
  }
  return true;
}

Assistant:

bool ActionMarkImplied::checkImpliedCover(Funcdata &data,Varnode *vn)

{
  PcodeOp *op,*storeop,*callop;
  Varnode *defvn;
  int4 i;

  op = vn->getDef();
  if (op->code() == CPUI_LOAD) { // Check for loads crossing stores
    list<PcodeOp *>::const_iterator oiter,iterend;
    iterend = data.endOp(CPUI_STORE);
    for(oiter=data.beginOp(CPUI_STORE);oiter!=iterend;++oiter) {
      storeop = *oiter;
      if (storeop->isDead()) continue;
      if (vn->getCover()->contain(storeop,2)) {
				// The LOAD crosses a STORE. We are cavalier
				// and let it through unless we can verify
				// that the pointers are actually the same
	if (storeop->getIn(0)->getOffset() == op->getIn(0)->getOffset()) {
	  //	  if (!functionalDifference(storeop->getIn(1),op->getIn(1),2)) return false;
	  if (isPossibleAlias(storeop->getIn(1),op->getIn(1),2)) return false;
	}
      }
    }
  }
  if (op->isCall() || (op->code() == CPUI_LOAD)) { // loads crossing calls
    for(i=0;i<data.numCalls();++i) {
      callop = data.getCallSpecs(i)->getOp();
      if (vn->getCover()->contain(callop,2)) return false;
    }
  }
  for(i=0;i<op->numInput();++i) {
    defvn = op->getIn(i);
    if (defvn->isConstant()) continue;
    if (data.getMerge().inflateTest(defvn,vn->getHigh()))	// Test for intersection
      return false;
  }
  return true;
}